

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::ConcurrentTransferSweptObjects
          (Recycler *this,RecyclerSweepManager *recyclerSweepManager)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  undefined4 *puVar4;
  RecyclerSweepManager *recyclerSweepManager_local;
  Recycler *this_local;
  
  bVar2 = RecyclerSweepManager::IsBackground(recyclerSweepManager);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1645,"(!recyclerSweepManager.IsBackground())",
                       "!recyclerSweepManager.IsBackground()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  CVar3 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->collectionState);
  if ((CVar3 & Collection_TransferSwept) != Collection_TransferSwept) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1646,
                       "((this->collectionState & Collection_TransferSwept) == Collection_TransferSwept)"
                       ,
                       "(this->collectionState & Collection_TransferSwept) == Collection_TransferSwept"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->hasBackgroundFinishPartial & 1U) != 0) {
    this->hasBackgroundFinishPartial = false;
    ClearPartialCollect(this);
  }
  HeapInfoManager::ConcurrentTransferSweptObjects(&this->autoHeap,recyclerSweepManager);
  return;
}

Assistant:

void
Recycler::ConcurrentTransferSweptObjects(RecyclerSweepManager& recyclerSweepManager)
{
    Assert(!recyclerSweepManager.IsBackground());
    Assert((this->collectionState & Collection_TransferSwept) == Collection_TransferSwept);
#if ENABLE_PARTIAL_GC
    if (this->hasBackgroundFinishPartial)
    {
        this->hasBackgroundFinishPartial = false;
        this->ClearPartialCollect();
    }
#endif
    autoHeap.ConcurrentTransferSweptObjects(recyclerSweepManager);
}